

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O0

int __thiscall RString::Find(RString *this,char c,int cStartPos,bool fIgnoreCase)

{
  bool bVar1;
  char *cptr;
  bool fIgnoreCase_local;
  int cStartPos_local;
  char c_local;
  RString *this_local;
  int local_4;
  
  cptr = this->myString + cStartPos;
  while( true ) {
    bVar1 = false;
    if (*cptr != '\0') {
      bVar1 = *cptr != c;
    }
    if (!bVar1) break;
    cptr = cptr + 1;
  }
  if (*cptr == '\0') {
    local_4 = -1;
  }
  else {
    local_4 = (int)cptr - (int)this->myString;
  }
  return local_4;
}

Assistant:

signed int RString::Find(const char c, int cStartPos, bool fIgnoreCase)
{
	char *cptr = myString + cStartPos;
	while(*cptr != '\0' && *cptr != c)
		cptr++;
	if(*cptr == '\0')
		return -1;
	return (cptr - myString);
}